

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
RemoveLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  
  iVar1 = this->current_size_;
  this->current_size_ = iVar1 + -1;
  (**(code **)(*this->rep_->elements[(long)iVar1 + -1] + 0x38))();
  return;
}

Assistant:

inline void RepeatedPtrFieldBase::RemoveLast() {
  GOOGLE_DCHECK_GT(current_size_, 0);
  TypeHandler::Clear(cast<TypeHandler>(rep_->elements[--current_size_]));
}